

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqstate.cpp
# Opt level: O0

SQTable * CreateDefaultDelegate(SQSharedState *ss,SQRegFunction *funcz)

{
  SQNativeClosure *this;
  bool bVar1;
  SQString *pSVar2;
  SQObjectPtr local_58;
  SQObjectPtr local_48;
  SQNativeClosure *local_38;
  SQNativeClosure *nc;
  SQTable *t;
  SQInteger i;
  SQRegFunction *funcz_local;
  SQSharedState *ss_local;
  
  t = (SQTable *)0x0;
  i = (SQInteger)funcz;
  funcz_local = (SQRegFunction *)ss;
  nc = (SQNativeClosure *)SQTable::Create(ss,0);
  while( true ) {
    if (*(long *)(i + (long)t * 0x20) == 0) {
      return (SQTable *)nc;
    }
    local_38 = SQNativeClosure::Create
                         ((SQSharedState *)funcz_local,*(SQFUNCTION *)(i + (long)t * 0x20 + 8),0);
    local_38->_nparamscheck = *(SQInteger *)(i + (long)t * 0x20 + 0x10);
    pSVar2 = SQString::Create((SQSharedState *)funcz_local,*(SQChar **)(i + (long)t * 0x20),-1);
    SQObjectPtr::operator=(&local_38->_name,pSVar2);
    if ((*(long *)(i + (long)t * 0x20 + 0x18) != 0) &&
       (bVar1 = CompileTypemask(&local_38->_typecheck,*(SQChar **)(i + (long)t * 0x20 + 0x18)),
       !bVar1)) break;
    this = nc;
    pSVar2 = SQString::Create((SQSharedState *)funcz_local,*(SQChar **)(i + (long)t * 0x20),-1);
    SQObjectPtr::SQObjectPtr(&local_48,pSVar2);
    SQObjectPtr::SQObjectPtr(&local_58,local_38);
    SQTable::NewSlot((SQTable *)this,&local_48,&local_58);
    SQObjectPtr::~SQObjectPtr(&local_58);
    SQObjectPtr::~SQObjectPtr(&local_48);
    t = (SQTable *)
        ((long)&(t->super_SQDelegable).super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted + 1
        );
  }
  return (SQTable *)0x0;
}

Assistant:

SQTable *CreateDefaultDelegate(SQSharedState *ss,const SQRegFunction *funcz)
{
    SQInteger i=0;
    SQTable *t=SQTable::Create(ss,0);
    while(funcz[i].name!=0){
        SQNativeClosure *nc = SQNativeClosure::Create(ss,funcz[i].f,0);
        nc->_nparamscheck = funcz[i].nparamscheck;
        nc->_name = SQString::Create(ss,funcz[i].name);
        if(funcz[i].typemask && !CompileTypemask(nc->_typecheck,funcz[i].typemask))
            return NULL;
        t->NewSlot(SQString::Create(ss,funcz[i].name),nc);
        i++;
    }
    return t;
}